

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O3

Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
yaml::Mapping::getInt
          (Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Mapping *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ExpectedRef<const_Value,_std::string> value_result;
  undefined1 local_58 [32];
  char local_38;
  size_type *local_30;
  size_type local_28;
  size_type local_20;
  undefined8 uStack_18;
  
  getValue((ExpectedRef<const_Value,_std::string> *)
           &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
              *)local_58)->value_,this,name);
  if (local_38 == '\0') {
    local_30 = &local_20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_30,local_58._0_8_,local_58._8_8_ + local_58._0_8_);
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    (__return_storage_ptr__->field_0).value_ = (long)paVar1;
    if (local_30 == &local_20) {
      paVar1->_M_allocated_capacity = local_20;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           uStack_18;
    }
    else {
      (__return_storage_ptr__->field_0).value_ = (long)local_30;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_20;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_28;
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    Value::getInt_abi_cxx11_(__return_storage_ptr__,(Value *)local_58._0_8_);
  }
  if ((local_38 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_58)->error_).error_ + 0x10U))) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<long int, std::string> Mapping::getInt(const std::string &name) const {
	const auto value_result = getValue(name);
	if (!value_result)
		return Unexpected(value_result.error());

	return value_result.value().get().getInt();
}